

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O2

bool __thiscall QGroupBox::event(QGroupBox *this,QEvent *e)

{
  bool bVar1;
  short sVar2;
  SubControl SVar3;
  long lVar4;
  QGroupBoxPrivate *this_00;
  QRect QVar5;
  QRect QVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  QStyle *pQVar10;
  QKeyEvent *k;
  long in_FS_OFFSET;
  QRect local_e8;
  QRect local_d8;
  QRect local_c8;
  QStyleOptionGroupBox box;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(short *)(e + 8) == 0x75) && (*(int *)(e + 0x18) == this_00->shortcutId)) {
    if (this_00->checkable == false) {
      QGroupBoxPrivate::_q_fixFocus(this_00,ShortcutFocusReason);
    }
    else {
      QGroupBoxPrivate::click(this_00);
      QWidget::setFocus(&this->super_QWidget,ShortcutFocusReason);
    }
    bVar8 = true;
    goto LAB_003df7df;
  }
  memset(&box,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&box);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&box);
  QVar6.x2.m_i = local_d8.x2.m_i;
  QVar6.y2.m_i = local_d8.y2.m_i;
  QVar6.x1.m_i = local_d8.x1.m_i;
  QVar6.y1.m_i = local_d8.y1.m_i;
  QVar5.x2.m_i = local_e8.x2.m_i;
  QVar5.y2.m_i = local_e8.y2.m_i;
  QVar5.x1.m_i = local_e8.x1.m_i;
  QVar5.y1.m_i = local_e8.y1.m_i;
  sVar2 = *(short *)(e + 8);
  if (sVar2 == 6) {
    bVar8 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e);
    if (bVar8) {
      this_00->pressedControl = SC_ComboBoxFrame;
      pQVar10 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&box,1,this);
      QWidget::update(&this->super_QWidget,&local_c8);
      QVar6.x2.m_i = local_d8.x2.m_i;
      QVar6.y2.m_i = local_d8.y2.m_i;
      QVar6.x1.m_i = local_d8.x1.m_i;
      QVar6.y1.m_i = local_d8.y1.m_i;
      QVar5.x2.m_i = local_e8.x2.m_i;
      QVar5.y2.m_i = local_e8.y2.m_i;
      QVar5.x1.m_i = local_e8.x1.m_i;
      QVar5.y1.m_i = local_e8.y1.m_i;
      bVar8 = true;
    }
    else {
LAB_003df7c8:
      bVar8 = QWidget::event(&this->super_QWidget,e);
      QVar6.x2.m_i = local_d8.x2.m_i;
      QVar6.y2.m_i = local_d8.y2.m_i;
      QVar6.x1.m_i = local_d8.x1.m_i;
      QVar6.y1.m_i = local_d8.y1.m_i;
      QVar5.x2.m_i = local_e8.x2.m_i;
      QVar5.y2.m_i = local_e8.y2.m_i;
      QVar5.x1.m_i = local_e8.x1.m_i;
      QVar5.y1.m_i = local_e8.y1.m_i;
    }
  }
  else if (sVar2 == 7) {
    bVar8 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e);
    QVar6.x2.m_i = local_d8.x2.m_i;
    QVar6.y2.m_i = local_d8.y2.m_i;
    QVar6.x1.m_i = local_d8.x1.m_i;
    QVar6.y1.m_i = local_d8.y1.m_i;
    QVar5.x2.m_i = local_e8.x2.m_i;
    QVar5.y2.m_i = local_e8.y2.m_i;
    QVar5.x1.m_i = local_e8.x1.m_i;
    QVar5.y1.m_i = local_e8.y1.m_i;
    if (!bVar8) goto LAB_003df7c8;
    SVar3 = this_00->pressedControl;
    this_00->pressedControl = SC_None;
    bVar8 = true;
    if (SVar3 - SC_ComboBoxFrame < 2) {
      QGroupBoxPrivate::click(this_00);
      QVar6.x2.m_i = local_d8.x2.m_i;
      QVar6.y2.m_i = local_d8.y2.m_i;
      QVar6.x1.m_i = local_d8.x1.m_i;
      QVar6.y1.m_i = local_d8.y1.m_i;
      QVar5.x2.m_i = local_e8.x2.m_i;
      QVar5.y2.m_i = local_e8.y2.m_i;
      QVar5.x1.m_i = local_e8.x1.m_i;
      QVar5.y1.m_i = local_e8.y1.m_i;
    }
  }
  else {
    if (sVar2 == 0x81) {
LAB_003df61c:
      pQVar10 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)QSinglePointEvent::position((QSinglePointEvent *)e);
      local_d8._0_8_ = QPointF::toPoint((QPointF *)&local_c8);
      iVar9 = (**(code **)(*(long *)pQVar10 + 0xd0))(pQVar10,7,&box,&local_d8,this);
      QVar6.x2.m_i = local_d8.x2.m_i;
      QVar6.y2.m_i = local_d8.y2.m_i;
      QVar6.x1.m_i = local_d8.x1.m_i;
      QVar6.y1.m_i = local_d8.y1.m_i;
      QVar5.x2.m_i = local_e8.x2.m_i;
      QVar5.y2.m_i = local_e8.y2.m_i;
      QVar5.x1.m_i = local_e8.x1.m_i;
      QVar5.y1.m_i = local_e8.y1.m_i;
      bVar7 = (bool)(iVar9 - 1U < 2 & this_00->checkable);
      bVar1 = this_00->hover;
      this_00->hover = bVar7;
      bVar8 = true;
      if (bVar1 == bVar7) goto LAB_003df7d5;
    }
    else {
      if (sVar2 != 0x80) {
        if (sVar2 != 0x7f) goto LAB_003df7c8;
        goto LAB_003df61c;
      }
      this_00->hover = false;
      bVar8 = true;
      if (this_00->checkable != true) goto LAB_003df7d5;
    }
    bVar8 = true;
    pQVar10 = QWidget::style(&this->super_QWidget);
    local_d8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&box,1,this);
    pQVar10 = QWidget::style(&this->super_QWidget);
    local_e8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&box,2,this);
    local_c8 = (QRect)QRect::operator|(&local_d8,&local_e8);
    QWidget::update(&this->super_QWidget,&local_c8);
    QVar5 = local_e8;
    QVar6 = local_d8;
  }
LAB_003df7d5:
  local_e8 = QVar5;
  local_d8 = QVar6;
  QStyleOptionGroupBox::~QStyleOptionGroupBox(&box);
LAB_003df7df:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QGroupBox::event(QEvent *e)
{
    Q_D(QGroupBox);
#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            if (!isCheckable()) {
                d->_q_fixFocus(Qt::ShortcutFocusReason);
            } else {
                d->click();
                setFocus(Qt::ShortcutFocusReason);
            }
            return true;
        }
    }
#endif
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    switch (e->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverMove: {
        QStyle::SubControl control = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                    static_cast<QHoverEvent *>(e)->position().toPoint(),
                                                                    this);
        bool oldHover = d->hover;
        d->hover = d->checkable && (control == QStyle::SC_GroupBoxLabel || control == QStyle::SC_GroupBoxCheckBox);
        if (oldHover != d->hover) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    }
    case QEvent::HoverLeave:
        d->hover = false;
        if (d->checkable) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            d->pressedControl = QStyle::SC_GroupBoxCheckBox;
            update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
            return true;
        }
        break;
    }
    case QEvent::KeyRelease: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            bool toggle = (d->pressedControl == QStyle::SC_GroupBoxLabel
                           || d->pressedControl == QStyle::SC_GroupBoxCheckBox);
            d->pressedControl = QStyle::SC_None;
            if (toggle)
                d->click();
            return true;
        }
        break;
    }
    default:
        break;
    }
    return QWidget::event(e);
}